

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O2

int Gia_ManCountConst0Pos(Aig_Man_t *p)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < p->nTruePos; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vCos,i);
    iVar2 = iVar2 + (uint)(*(ulong *)((long)pvVar1 + 8) == ((ulong)p->pConst1 ^ 1));
  }
  return iVar2;
}

Assistant:

int Gia_ManCountConst0Pos( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachPo( p, pObj, i )
        Counter += (Aig_ObjChild0(pObj) == Aig_ManConst0(p));
    return Counter;
}